

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::ZoneVector<asmjit::_abi_1_10::RABlock_*>::append
          (ZoneVector<asmjit::_abi_1_10::RABlock_*> *this,ZoneAllocator *allocator,RABlock **item)

{
  size_type *psVar1;
  uint uVar2;
  Error EVar3;
  
  uVar2 = (this->super_ZoneVectorBase)._size;
  if (uVar2 == (this->super_ZoneVectorBase)._capacity) {
    EVar3 = grow(this,allocator,1);
    if (EVar3 != 0) {
      return EVar3;
    }
    uVar2 = (this->super_ZoneVectorBase)._size;
  }
  *(RABlock **)((long)(this->super_ZoneVectorBase)._data + (ulong)uVar2 * 8) = *item;
  psVar1 = &(this->super_ZoneVectorBase)._size;
  *psVar1 = *psVar1 + 1;
  return 0;
}

Assistant:

ASMJIT_FORCE_INLINE Error append(ZoneAllocator* allocator, const T& item) noexcept {
    if (ASMJIT_UNLIKELY(_size == _capacity))
      ASMJIT_PROPAGATE(grow(allocator, 1));

    memcpy(static_cast<T*>(_data) + _size, &item, sizeof(T));
    _size++;

    return kErrorOk;
  }